

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::SetScrollLeft(Element *this,float scroll_left)

{
  Vector2f VVar1;
  float fVar2;
  float fVar3;
  float local_68;
  Dictionary local_38;
  
  fVar3 = (this->scrollable_overflow_rectangle).x;
  VVar1 = Box::GetSize(&this->main_box,Padding);
  fVar2 = ElementScroll::GetScrollbarSize(&this->meta->scroll,VERTICAL);
  local_68 = VVar1.x;
  if (fVar3 <= local_68 - fVar2) {
    fVar3 = local_68 - fVar2;
  }
  VVar1 = Box::GetSize(&this->main_box,Padding);
  fVar2 = ElementScroll::GetScrollbarSize(&this->meta->scroll,VERTICAL);
  local_68 = VVar1.x;
  fVar3 = fVar3 - (local_68 - fVar2);
  if (scroll_left <= fVar3) {
    fVar3 = scroll_left;
  }
  fVar3 = Math::Round((float)(~-(uint)(scroll_left < 0.0) & (uint)fVar3));
  if ((fVar3 != (this->scroll_offset).x) || (NAN(fVar3) || NAN((this->scroll_offset).x))) {
    (this->scroll_offset).x = fVar3;
    ElementScroll::UpdateScrollbar(&this->meta->scroll,HORIZONTAL);
    if (this->absolute_offset_dirty == false) {
      DirtyAbsoluteOffsetRecursive(this);
    }
    local_38.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DispatchEvent(this,Scroll,&local_38);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_38.m_container);
  }
  return;
}

Assistant:

void Element::SetScrollLeft(float scroll_left)
{
	const float new_offset = Math::Round(Math::Clamp(scroll_left, 0.0f, GetScrollWidth() - GetClientWidth()));
	if (new_offset != scroll_offset.x)
	{
		scroll_offset.x = new_offset;
		meta->scroll.UpdateScrollbar(ElementScroll::HORIZONTAL);
		DirtyAbsoluteOffset();

		DispatchEvent(EventId::Scroll, Dictionary());
	}
}